

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclError.cpp
# Opt level: O0

char * xmrig::OclError::toString(cl_int ret)

{
  cl_int ret_local;
  char *local_8;
  
  switch(ret) {
  case 0:
    local_8 = "CL_SUCCESS";
    break;
  case -0x46:
    local_8 = "CL_INVALID_DEVICE_QUEUE";
    break;
  case -0x45:
    local_8 = "CL_INVALID_PIPE_SIZE";
    break;
  case -0x44:
    local_8 = "CL_INVALID_DEVICE_PARTITION_COUNT";
    break;
  case -0x43:
    local_8 = "CL_INVALID_LINKER_OPTIONS";
    break;
  case -0x42:
    local_8 = "CL_INVALID_COMPILER_OPTIONS";
    break;
  case -0x41:
    local_8 = "CL_INVALID_IMAGE_DESCRIPTOR";
    break;
  case -0x40:
    local_8 = "CL_INVALID_PROPERTY";
    break;
  case -0x3f:
    local_8 = "CL_INVALID_GLOBAL_WORK_SIZE";
    break;
  case -0x3e:
    local_8 = "CL_INVALID_MIP_LEVEL";
    break;
  case -0x3d:
    local_8 = "CL_INVALID_BUFFER_SIZE";
    break;
  case -0x3c:
    local_8 = "CL_INVALID_GL_OBJECT";
    break;
  case -0x3b:
    local_8 = "CL_INVALID_OPERATION";
    break;
  case -0x3a:
    local_8 = "CL_INVALID_EVENT";
    break;
  case -0x39:
    local_8 = "CL_INVALID_EVENT_WAIT_LIST";
    break;
  case -0x38:
    local_8 = "CL_INVALID_GLOBAL_OFFSET";
    break;
  case -0x37:
    local_8 = "CL_INVALID_WORK_ITEM_SIZE";
    break;
  case -0x36:
    local_8 = "CL_INVALID_WORK_GROUP_SIZE";
    break;
  case -0x35:
    local_8 = "CL_INVALID_WORK_DIMENSION";
    break;
  case -0x34:
    local_8 = "CL_INVALID_KERNEL_ARGS";
    break;
  case -0x33:
    local_8 = "CL_INVALID_ARG_SIZE";
    break;
  case -0x32:
    local_8 = "CL_INVALID_ARG_VALUE";
    break;
  case -0x31:
    local_8 = "CL_INVALID_ARG_INDEX";
    break;
  case -0x30:
    local_8 = "CL_INVALID_KERNEL";
    break;
  case -0x2f:
    local_8 = "CL_INVALID_KERNEL_DEFINITION";
    break;
  case -0x2e:
    local_8 = "CL_INVALID_KERNEL_NAME";
    break;
  case -0x2d:
    local_8 = "CL_INVALID_PROGRAM_EXECUTABLE";
    break;
  case -0x2c:
    local_8 = "CL_INVALID_PROGRAM";
    break;
  case -0x2b:
    local_8 = "CL_INVALID_BUILD_OPTIONS";
    break;
  case -0x2a:
    local_8 = "CL_INVALID_BINARY";
    break;
  case -0x29:
    local_8 = "CL_INVALID_SAMPLER";
    break;
  case -0x28:
    local_8 = "CL_INVALID_IMAGE_SIZE";
    break;
  case -0x27:
    local_8 = "CL_INVALID_IMAGE_FORMAT_DESCRIPTOR";
    break;
  case -0x26:
    local_8 = "CL_INVALID_MEM_OBJECT";
    break;
  case -0x25:
    local_8 = "CL_INVALID_HOST_PTR";
    break;
  case -0x24:
    local_8 = "CL_INVALID_COMMAND_QUEUE";
    break;
  case -0x23:
    local_8 = "CL_INVALID_QUEUE_PROPERTIES";
    break;
  case -0x22:
    local_8 = "CL_INVALID_CONTEXT";
    break;
  case -0x21:
    local_8 = "CL_INVALID_DEVICE";
    break;
  case -0x20:
    local_8 = "CL_INVALID_PLATFORM";
    break;
  case -0x1f:
    local_8 = "CL_INVALID_DEVICE_TYPE";
    break;
  case -0x1e:
    local_8 = "CL_INVALID_VALUE";
    break;
  default:
    local_8 = "UNKNOWN_ERROR";
    break;
  case -0x13:
    local_8 = "CL_KERNEL_ARG_INFO_NOT_AVAILABLE";
    break;
  case -0x12:
    local_8 = "CL_DEVICE_PARTITION_FAILED";
    break;
  case -0x11:
    local_8 = "CL_LINK_PROGRAM_FAILURE";
    break;
  case -0x10:
    local_8 = "CL_LINKER_NOT_AVAILABLE";
    break;
  case -0xf:
    local_8 = "CL_COMPILE_PROGRAM_FAILURE";
    break;
  case -0xe:
    local_8 = "CL_EXEC_STATUS_ERROR_FOR_EVENTS_IN_WAIT_LIST";
    break;
  case -0xd:
    local_8 = "CL_MISALIGNED_SUB_BUFFER_OFFSET";
    break;
  case -0xc:
    local_8 = "CL_MAP_FAILURE";
    break;
  case -0xb:
    local_8 = "CL_BUILD_PROGRAM_FAILURE";
    break;
  case -10:
    local_8 = "CL_IMAGE_FORMAT_NOT_SUPPORTED";
    break;
  case -9:
    local_8 = "CL_IMAGE_FORMAT_MISMATCH";
    break;
  case -8:
    local_8 = "CL_MEM_COPY_OVERLAP";
    break;
  case -7:
    local_8 = "CL_PROFILING_INFO_NOT_AVAILABLE";
    break;
  case -6:
    local_8 = "CL_OUT_OF_HOST_MEMORY";
    break;
  case -5:
    local_8 = "CL_OUT_OF_RESOURCES";
    break;
  case -4:
    local_8 = "CL_MEM_OBJECT_ALLOCATION_FAILURE";
    break;
  case -3:
    local_8 = "CL_COMPILER_NOT_AVAILABLE";
    break;
  case -2:
    local_8 = "CL_DEVICE_NOT_AVAILABLE";
    break;
  case -1:
    local_8 = "CL_DEVICE_NOT_FOUND";
  }
  return local_8;
}

Assistant:

const char *xmrig::OclError::toString(cl_int ret)
{
    switch(ret)
    {
    case CL_SUCCESS:
        return "CL_SUCCESS";
    case CL_DEVICE_NOT_FOUND:
        return "CL_DEVICE_NOT_FOUND";
    case CL_DEVICE_NOT_AVAILABLE:
        return "CL_DEVICE_NOT_AVAILABLE";
    case CL_COMPILER_NOT_AVAILABLE:
        return "CL_COMPILER_NOT_AVAILABLE";
    case CL_MEM_OBJECT_ALLOCATION_FAILURE:
        return "CL_MEM_OBJECT_ALLOCATION_FAILURE";
    case CL_OUT_OF_RESOURCES:
        return "CL_OUT_OF_RESOURCES";
    case CL_OUT_OF_HOST_MEMORY:
        return "CL_OUT_OF_HOST_MEMORY";
    case CL_PROFILING_INFO_NOT_AVAILABLE:
        return "CL_PROFILING_INFO_NOT_AVAILABLE";
    case CL_MEM_COPY_OVERLAP:
        return "CL_MEM_COPY_OVERLAP";
    case CL_IMAGE_FORMAT_MISMATCH:
        return "CL_IMAGE_FORMAT_MISMATCH";
    case CL_IMAGE_FORMAT_NOT_SUPPORTED:
        return "CL_IMAGE_FORMAT_NOT_SUPPORTED";
    case CL_BUILD_PROGRAM_FAILURE:
        return "CL_BUILD_PROGRAM_FAILURE";
    case CL_MAP_FAILURE:
        return "CL_MAP_FAILURE";
    case CL_MISALIGNED_SUB_BUFFER_OFFSET:
        return "CL_MISALIGNED_SUB_BUFFER_OFFSET";
    case CL_EXEC_STATUS_ERROR_FOR_EVENTS_IN_WAIT_LIST:
        return "CL_EXEC_STATUS_ERROR_FOR_EVENTS_IN_WAIT_LIST";
    case CL_COMPILE_PROGRAM_FAILURE:
        return "CL_COMPILE_PROGRAM_FAILURE";
    case CL_LINKER_NOT_AVAILABLE:
        return "CL_LINKER_NOT_AVAILABLE";
    case CL_LINK_PROGRAM_FAILURE:
        return "CL_LINK_PROGRAM_FAILURE";
    case CL_DEVICE_PARTITION_FAILED:
        return "CL_DEVICE_PARTITION_FAILED";
    case CL_KERNEL_ARG_INFO_NOT_AVAILABLE:
        return "CL_KERNEL_ARG_INFO_NOT_AVAILABLE";
    case CL_INVALID_VALUE:
        return "CL_INVALID_VALUE";
    case CL_INVALID_DEVICE_TYPE:
        return "CL_INVALID_DEVICE_TYPE";
    case CL_INVALID_PLATFORM:
        return "CL_INVALID_PLATFORM";
    case CL_INVALID_DEVICE:
        return "CL_INVALID_DEVICE";
    case CL_INVALID_CONTEXT:
        return "CL_INVALID_CONTEXT";
    case CL_INVALID_QUEUE_PROPERTIES:
        return "CL_INVALID_QUEUE_PROPERTIES";
    case CL_INVALID_COMMAND_QUEUE:
        return "CL_INVALID_COMMAND_QUEUE";
    case CL_INVALID_HOST_PTR:
        return "CL_INVALID_HOST_PTR";
    case CL_INVALID_MEM_OBJECT:
        return "CL_INVALID_MEM_OBJECT";
    case CL_INVALID_IMAGE_FORMAT_DESCRIPTOR:
        return "CL_INVALID_IMAGE_FORMAT_DESCRIPTOR";
    case CL_INVALID_IMAGE_SIZE:
        return "CL_INVALID_IMAGE_SIZE";
    case CL_INVALID_SAMPLER:
        return "CL_INVALID_SAMPLER";
    case CL_INVALID_BINARY:
        return "CL_INVALID_BINARY";
    case CL_INVALID_BUILD_OPTIONS:
        return "CL_INVALID_BUILD_OPTIONS";
    case CL_INVALID_PROGRAM:
        return "CL_INVALID_PROGRAM";
    case CL_INVALID_PROGRAM_EXECUTABLE:
        return "CL_INVALID_PROGRAM_EXECUTABLE";
    case CL_INVALID_KERNEL_NAME:
        return "CL_INVALID_KERNEL_NAME";
    case CL_INVALID_KERNEL_DEFINITION:
        return "CL_INVALID_KERNEL_DEFINITION";
    case CL_INVALID_KERNEL:
        return "CL_INVALID_KERNEL";
    case CL_INVALID_ARG_INDEX:
        return "CL_INVALID_ARG_INDEX";
    case CL_INVALID_ARG_VALUE:
        return "CL_INVALID_ARG_VALUE";
    case CL_INVALID_ARG_SIZE:
        return "CL_INVALID_ARG_SIZE";
    case CL_INVALID_KERNEL_ARGS:
        return "CL_INVALID_KERNEL_ARGS";
    case CL_INVALID_WORK_DIMENSION:
        return "CL_INVALID_WORK_DIMENSION";
    case CL_INVALID_WORK_GROUP_SIZE:
        return "CL_INVALID_WORK_GROUP_SIZE";
    case CL_INVALID_WORK_ITEM_SIZE:
        return "CL_INVALID_WORK_ITEM_SIZE";
    case CL_INVALID_GLOBAL_OFFSET:
        return "CL_INVALID_GLOBAL_OFFSET";
    case CL_INVALID_EVENT_WAIT_LIST:
        return "CL_INVALID_EVENT_WAIT_LIST";
    case CL_INVALID_EVENT:
        return "CL_INVALID_EVENT";
    case CL_INVALID_OPERATION:
        return "CL_INVALID_OPERATION";
    case CL_INVALID_GL_OBJECT:
        return "CL_INVALID_GL_OBJECT";
    case CL_INVALID_BUFFER_SIZE:
        return "CL_INVALID_BUFFER_SIZE";
    case CL_INVALID_MIP_LEVEL:
        return "CL_INVALID_MIP_LEVEL";
    case CL_INVALID_GLOBAL_WORK_SIZE:
        return "CL_INVALID_GLOBAL_WORK_SIZE";
    case CL_INVALID_PROPERTY:
        return "CL_INVALID_PROPERTY";
    case CL_INVALID_IMAGE_DESCRIPTOR:
        return "CL_INVALID_IMAGE_DESCRIPTOR";
    case CL_INVALID_COMPILER_OPTIONS:
        return "CL_INVALID_COMPILER_OPTIONS";
    case CL_INVALID_LINKER_OPTIONS:
        return "CL_INVALID_LINKER_OPTIONS";
    case CL_INVALID_DEVICE_PARTITION_COUNT:
        return "CL_INVALID_DEVICE_PARTITION_COUNT";
#ifdef CL_VERSION_2_0
    case CL_INVALID_PIPE_SIZE:
        return "CL_INVALID_PIPE_SIZE";
    case CL_INVALID_DEVICE_QUEUE:
        return "CL_INVALID_DEVICE_QUEUE";
#endif
    default:
        return "UNKNOWN_ERROR";
    }
}